

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::Triple(Triple *this,Twine *Str)

{
  ArchType AVar1;
  SubArchType SVar2;
  VendorType VVar3;
  OSType OVar4;
  EnvironmentType EVar5;
  ObjectFormatType OVar6;
  size_t sVar7;
  StringRef local_118;
  undefined1 local_108 [8];
  SmallVector<llvm::StringRef,_4U> Components;
  Twine *Str_local;
  Triple *this_local;
  
  Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
  super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = Str;
  Twine::str_abi_cxx11_(&this->Data,Str);
  this->Arch = UnknownArch;
  this->SubArch = NoSubArch;
  this->Vendor = UnknownVendor;
  this->OS = UnknownOS;
  this->Environment = UnknownEnvironment;
  this->ObjectFormat = UnknownObjectFormat;
  SmallVector<llvm::StringRef,_4U>::SmallVector((SmallVector<llvm::StringRef,_4U> *)local_108);
  local_118.Data = (char *)std::__cxx11::string::data();
  local_118.Length = std::__cxx11::string::length();
  StringRef::split(&local_118,(SmallVectorImpl<llvm::StringRef> *)local_108,'-',3,true);
  sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
  if (sVar7 != 0) {
    sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
    if (sVar7 == 0) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    AVar1 = parseArch(*(StringRef *)local_108);
    this->Arch = AVar1;
    sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
    if (sVar7 == 0) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    SVar2 = parseSubArch(*(StringRef *)local_108);
    this->SubArch = SVar2;
    sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
    if (1 < sVar7) {
      sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
      if (sVar7 < 2) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                     );
      }
      VVar3 = parseVendor(*(StringRef *)((long)local_108 + 0x10));
      this->Vendor = VVar3;
      sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
      if (2 < sVar7) {
        sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
        if (sVar7 < 3) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        OVar4 = parseOS(*(StringRef *)((long)local_108 + 0x20));
        this->OS = OVar4;
        sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
        if (3 < sVar7) {
          sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
          if (sVar7 < 4) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          EVar5 = parseEnvironment(*(StringRef *)((long)local_108 + 0x30));
          this->Environment = EVar5;
          sVar7 = SmallVectorBase::size((SmallVectorBase *)local_108);
          if (sVar7 < 4) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          OVar6 = parseFormat(*(StringRef *)((long)local_108 + 0x30));
          this->ObjectFormat = OVar6;
        }
      }
    }
  }
  if (this->ObjectFormat == UnknownObjectFormat) {
    OVar6 = getDefaultFormat(this);
    this->ObjectFormat = OVar6;
  }
  SmallVector<llvm::StringRef,_4U>::~SmallVector((SmallVector<llvm::StringRef,_4U> *)local_108);
  return;
}

Assistant:

Triple::Triple(const Twine &Str)
    : Data(Str.str()), Arch(UnknownArch), SubArch(NoSubArch),
      Vendor(UnknownVendor), OS(UnknownOS), Environment(UnknownEnvironment),
      ObjectFormat(UnknownObjectFormat) {
  // Do minimal parsing by hand here.
  SmallVector<StringRef, 4> Components;
  StringRef(Data).split(Components, '-', /*MaxSplit*/ 3);
  if (Components.size() > 0) {
    Arch = parseArch(Components[0]);
    SubArch = parseSubArch(Components[0]);
    if (Components.size() > 1) {
      Vendor = parseVendor(Components[1]);
      if (Components.size() > 2) {
        OS = parseOS(Components[2]);
        if (Components.size() > 3) {
          Environment = parseEnvironment(Components[3]);
          ObjectFormat = parseFormat(Components[3]);
        }
      }
    }
  }
  if (ObjectFormat == UnknownObjectFormat)
    ObjectFormat = getDefaultFormat(*this);
}